

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall
QListWidgetPrivate::emitCurrentItemChanged
          (QListWidgetPrivate *this,QModelIndex *current,QModelIndex *previous)

{
  QListWidgetItem *this_00;
  ulong uVar1;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  QListWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QListWidgetItem *currentItem;
  QListWidget *q;
  QPersistentModelIndex persistentCurrent;
  QListWidget *in_stack_ffffffffffffff68;
  QString *_t1;
  int _t1_00;
  QListModel *in_stack_ffffffffffffff70;
  QListWidgetItem *in_stack_ffffffffffffff78;
  QPersistentModelIndex *this_01;
  QListWidgetItem *local_50;
  QString local_28;
  QPersistentModelIndex local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QListWidgetItem *)q_func(in_RDI);
  local_10.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex(&local_10,in_RSI);
  listModel((QListWidgetPrivate *)0x89d4da);
  QPersistentModelIndex::row();
  local_50 = QListModel::at(in_stack_ffffffffffffff70,
                            (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  listModel((QListWidgetPrivate *)0x89d51b);
  QModelIndex::row(in_RDX);
  QListModel::at(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  QListWidget::currentItemChanged
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff78,
             (QListWidgetItem *)in_stack_ffffffffffffff70);
  uVar1 = QPersistentModelIndex::isValid();
  if ((uVar1 & 1) == 0) {
    local_50 = (QListWidgetItem *)0x0;
  }
  if (local_50 == (QListWidgetItem *)0x0) {
    QString::QString((QString *)0x89d58f);
  }
  else {
    QListWidgetItem::text(this_00);
  }
  _t1 = &local_28;
  QListWidget::currentTextChanged((QListWidget *)in_stack_ffffffffffffff70,_t1);
  _t1_00 = (int)((ulong)_t1 >> 0x20);
  QString::~QString((QString *)0x89d5ab);
  this_01 = &local_10;
  QPersistentModelIndex::row();
  QListWidget::currentRowChanged((QListWidget *)0x89d5d3,_t1_00);
  QPersistentModelIndex::~QPersistentModelIndex(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetPrivate::emitCurrentItemChanged(const QModelIndex &current,
                                                const QModelIndex &previous)
{
    Q_Q(QListWidget);
    QPersistentModelIndex persistentCurrent = current;
    QListWidgetItem *currentItem = listModel()->at(persistentCurrent.row());
    emit q->currentItemChanged(currentItem, listModel()->at(previous.row()));

    //persistentCurrent is invalid if something changed the model in response
    //to the currentItemChanged signal emission and the item was removed
    if (!persistentCurrent.isValid()) {
        currentItem = nullptr;
    }

    emit q->currentTextChanged(currentItem ? currentItem->text() : QString());
    emit q->currentRowChanged(persistentCurrent.row());
}